

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KVStringPair.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::KVStringPair::KVStringPair
          (KVStringPair *this,XMLCh *key,XMLSize_t keyLength,XMLCh *value,XMLSize_t valueLength,
          MemoryManager *manager)

{
  size_t __n;
  int iVar1;
  undefined4 extraout_var;
  XMLCh *__dest;
  undefined4 extraout_var_00;
  
  (this->super_XSerializable)._vptr_XSerializable = (_func_int **)&PTR__KVStringPair_004005b8;
  this->fKeyAllocSize = 0;
  this->fValueAllocSize = 0;
  this->fKey = (XMLCh *)0x0;
  this->fValue = (XMLCh *)0x0;
  this->fMemoryManager = manager;
  (*manager->_vptr_MemoryManager[4])(manager,0);
  this->fKey = (XMLCh *)0x0;
  this->fKeyAllocSize = keyLength + 1;
  __n = keyLength * 2 + 2;
  iVar1 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,__n);
  this->fKey = (XMLCh *)CONCAT44(extraout_var,iVar1);
  memcpy((XMLCh *)CONCAT44(extraout_var,iVar1),key,__n);
  if (valueLength < this->fValueAllocSize) {
    __dest = this->fValue;
  }
  else {
    (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fValue);
    this->fValue = (XMLCh *)0x0;
    this->fValueAllocSize = valueLength + 1;
    iVar1 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                      (this->fMemoryManager,valueLength * 2 + 2);
    __dest = (XMLCh *)CONCAT44(extraout_var_00,iVar1);
    this->fValue = __dest;
  }
  memcpy(__dest,value,valueLength * 2 + 2);
  return;
}

Assistant:

KVStringPair::KVStringPair(const XMLCh* const key,
                           const XMLSize_t    keyLength,
                           const XMLCh* const value,
                           const XMLSize_t    valueLength,
                           MemoryManager* const manager)
:fKeyAllocSize(0)
,fValueAllocSize(0)
,fKey(0)
,fValue(0)
,fMemoryManager(manager)
{    
    setKey(key, keyLength);
    setValue(value, valueLength);
}